

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlInput.cpp
# Opt level: O0

void __thiscall
Rml::ElementFormControlInput::OnAttributeChange
          (ElementFormControlInput *this,ElementAttributes *changed_attributes)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  ulong uVar5;
  pointer pIVar6;
  unique_ptr<Rml::InputTypeText,_std::default_delete<Rml::InputTypeText>_> local_110;
  ElementFormControlInput *local_108;
  unique_ptr<Rml::InputTypeButton,_std::default_delete<Rml::InputTypeButton>_> local_100;
  ElementFormControlInput *local_f8;
  unique_ptr<Rml::InputTypeSubmit,_std::default_delete<Rml::InputTypeSubmit>_> local_f0;
  ElementFormControlInput *local_e8;
  unique_ptr<Rml::InputTypeRange,_std::default_delete<Rml::InputTypeRange>_> local_e0;
  ElementFormControlInput *local_d8;
  unique_ptr<Rml::InputTypeCheckbox,_std::default_delete<Rml::InputTypeCheckbox>_> local_d0;
  ElementFormControlInput *local_c8;
  unique_ptr<Rml::InputTypeRadio,_std::default_delete<Rml::InputTypeRadio>_> local_c0;
  undefined4 local_b4;
  ElementFormControlInput *local_b0;
  unique_ptr<Rml::InputTypeText,_std::default_delete<Rml::InputTypeText>_> local_a8;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_58 [3];
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_40;
  const_iterator it_type;
  String new_type_name;
  ElementAttributes *changed_attributes_local;
  ElementFormControlInput *this_local;
  
  ElementFormControl::OnAttributeChange(&this->super_ElementFormControl,changed_attributes);
  ::std::__cxx11::string::string((string *)&it_type);
  local_40._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[5]>(changed_attributes,(char (*) [5])0x70b71f);
  local_58[0]._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::end(changed_attributes);
  bVar2 = __gnu_cxx::operator!=(&local_40,local_58);
  if (bVar2) {
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
             ::operator->(&local_40);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"text",&local_99);
    Variant::Get<std::__cxx11::string>(&local_78,&ppVar4->second,&local_98);
    ::std::__cxx11::string::operator=((string *)&it_type,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::allocator<char>::~allocator(&local_99);
  }
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->type);
  if ((!bVar2) ||
     ((uVar5 = ::std::__cxx11::string::empty(), (uVar5 & 1) == 0 &&
      (bVar2 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&it_type,&this->type_name), bVar2)))) {
    ::std::unique_ptr<Rml::InputType,_std::default_delete<Rml::InputType>_>::reset
              (&this->type,(pointer)0x0);
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &it_type,"password");
    if (bVar2) {
      local_b4 = 1;
      local_b0 = this;
      MakeUnique<Rml::InputTypeText,Rml::ElementFormControlInput*,Rml::InputTypeText::Visibility>
                ((ElementFormControlInput **)&local_a8,(Visibility *)&local_b0);
      ::std::unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>>::operator=
                ((unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>> *)&this->type,
                 &local_a8);
      ::std::unique_ptr<Rml::InputTypeText,_std::default_delete<Rml::InputTypeText>_>::~unique_ptr
                (&local_a8);
    }
    else {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&it_type,"radio");
      if (bVar2) {
        local_c8 = this;
        MakeUnique<Rml::InputTypeRadio,Rml::ElementFormControlInput*>
                  ((ElementFormControlInput **)&local_c0);
        ::std::unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>>::operator=
                  ((unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>> *)&this->type,
                   &local_c0);
        ::std::unique_ptr<Rml::InputTypeRadio,_std::default_delete<Rml::InputTypeRadio>_>::
        ~unique_ptr(&local_c0);
      }
      else {
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&it_type,"checkbox");
        if (bVar2) {
          local_d8 = this;
          MakeUnique<Rml::InputTypeCheckbox,Rml::ElementFormControlInput*>
                    ((ElementFormControlInput **)&local_d0);
          ::std::unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>>::operator=
                    ((unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>> *)&this->type,
                     &local_d0);
          ::std::unique_ptr<Rml::InputTypeCheckbox,_std::default_delete<Rml::InputTypeCheckbox>_>::
          ~unique_ptr(&local_d0);
        }
        else {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&it_type,"range");
          if (bVar2) {
            local_e8 = this;
            MakeUnique<Rml::InputTypeRange,Rml::ElementFormControlInput*>
                      ((ElementFormControlInput **)&local_e0);
            ::std::unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>>::operator=
                      ((unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>> *)&this->type
                       ,&local_e0);
            ::std::unique_ptr<Rml::InputTypeRange,_std::default_delete<Rml::InputTypeRange>_>::
            ~unique_ptr(&local_e0);
          }
          else {
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&it_type,"submit");
            if (bVar2) {
              local_f8 = this;
              MakeUnique<Rml::InputTypeSubmit,Rml::ElementFormControlInput*>
                        ((ElementFormControlInput **)&local_f0);
              ::std::unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>>::operator=
                        ((unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>> *)
                         &this->type,&local_f0);
              ::std::unique_ptr<Rml::InputTypeSubmit,_std::default_delete<Rml::InputTypeSubmit>_>::
              ~unique_ptr(&local_f0);
            }
            else {
              bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&it_type,"button");
              if (bVar2) {
                local_108 = this;
                MakeUnique<Rml::InputTypeButton,Rml::ElementFormControlInput*>
                          ((ElementFormControlInput **)&local_100);
                ::std::unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>>::operator=
                          ((unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>> *)
                           &this->type,&local_100);
                ::std::unique_ptr<Rml::InputTypeButton,_std::default_delete<Rml::InputTypeButton>_>
                ::~unique_ptr(&local_100);
              }
              else {
                ::std::__cxx11::string::operator=((string *)&it_type,"text");
                MakeUnique<Rml::InputTypeText,Rml::ElementFormControlInput*>
                          ((ElementFormControlInput **)&local_110);
                ::std::unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>>::operator=
                          ((unique_ptr<Rml::InputType,std::default_delete<Rml::InputType>> *)
                           &this->type,&local_110);
                ::std::unique_ptr<Rml::InputTypeText,_std::default_delete<Rml::InputTypeText>_>::
                ~unique_ptr(&local_110);
              }
            }
          }
        }
      }
    }
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Element::SetClass((Element *)this,&this->type_name,false);
    }
    Element::SetClass((Element *)this,(String *)&it_type,true);
    ::std::__cxx11::string::operator=((string *)&this->type_name,(string *)&it_type);
    (*(this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
      _vptr_Releasable[0x15])();
  }
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->type);
  if ((!bVar2) &&
     (bVar2 = Assert("RMLUI_ASSERT(type)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Elements/ElementFormControlInput.cpp"
                     ,0x9e), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pIVar6 = ::std::unique_ptr<Rml::InputType,_std::default_delete<Rml::InputType>_>::operator->
                     (&this->type);
  uVar3 = (*pIVar6->_vptr_InputType[8])(pIVar6,changed_attributes);
  if ((uVar3 & 1) == 0) {
    (*(this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
      _vptr_Releasable[0x15])();
  }
  ::std::__cxx11::string::~string((string *)&it_type);
  return;
}

Assistant:

void ElementFormControlInput::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	ElementFormControl::OnAttributeChange(changed_attributes);

	String new_type_name;

	auto it_type = changed_attributes.find("type");
	if (it_type != changed_attributes.end())
	{
		new_type_name = it_type->second.Get<String>("text");
	}

	if (!type || (!new_type_name.empty() && new_type_name != type_name))
	{
		// Reset the existing type before constructing a new one. This ensures the old type removes properties and event
		// listeners attached to this element, so it does not interfere with new ones being attached by the new type.
		type.reset();

		if (new_type_name == "password")
			type = MakeUnique<InputTypeText>(this, InputTypeText::OBSCURED);
		else if (new_type_name == "radio")
			type = MakeUnique<InputTypeRadio>(this);
		else if (new_type_name == "checkbox")
			type = MakeUnique<InputTypeCheckbox>(this);
		else if (new_type_name == "range")
			type = MakeUnique<InputTypeRange>(this);
		else if (new_type_name == "submit")
			type = MakeUnique<InputTypeSubmit>(this);
		else if (new_type_name == "button")
			type = MakeUnique<InputTypeButton>(this);
		else
		{
			new_type_name = "text";
			type = MakeUnique<InputTypeText>(this);
		}

		if (!type_name.empty())
			SetClass(type_name, false);
		SetClass(new_type_name, true);
		type_name = new_type_name;

		DirtyLayout();
	}

	RMLUI_ASSERT(type);

	if (!type->OnAttributeChange(changed_attributes))
		DirtyLayout();
}